

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O2

void prsxsend(prscxdef *ctx)

{
  ushort uVar1;
  FILE *__stream;
  ushort uVar2;
  ulong uVar3;
  uint16_t tmp;
  
  uVar1 = ctx->prscxslen;
  uVar3 = (ulong)ctx->prscxsofs;
  *(ushort *)(ctx->prscxpool + uVar3) = uVar1;
  __stream = (FILE *)ctx->prscxstrfile;
  if (__stream != (FILE *)0x0) {
    ctx->prscxpool[uVar1 + uVar3] = '\0';
    fputs((char *)(ctx->prscxpool + uVar3 + 2),__stream);
    fputs("\n",(FILE *)ctx->prscxstrfile);
  }
  uVar2 = uVar1 + 7 & 0xfff8;
  if (uVar2 != uVar1) {
    uVar2 = uVar2 - uVar1;
    if (ctx->prscxnrem < uVar2) {
      errsigf(ctx->prscxerr,"TADS",0x131);
    }
    ctx->prscxnode = ctx->prscxnode + uVar2;
    ctx->prscxnrem = ctx->prscxnrem - uVar2;
  }
  return;
}

Assistant:

void prsxsend(prscxdef *ctx)
{
    ushort siz;
    ushort rounded;
    
    /* figure total size of string, including padding for alignment */
    siz = ctx->prscxslen;
    
    /* write length at beginning of string */
    oswp2(&ctx->prscxpool[ctx->prscxsofs], siz);
    
    /* if desired, write the string to the strings file */
    if (ctx->prscxstrfile != 0)
    {
        uchar *str;

        str = &ctx->prscxpool[ctx->prscxsofs] + 2;
        str[siz - 2] = '\0';
        osfputs((char *)str, ctx->prscxstrfile);
        osfputs("\n", ctx->prscxstrfile);
    }

    /* round size of string if necessary */
    rounded = osrndsz(siz);
    if (rounded - siz)
    {
        rounded -= siz;
        if (ctx->prscxnrem < rounded)
            errsig(ctx->prscxerr, ERR_NONODE);
        ctx->prscxnode += rounded;
        ctx->prscxnrem -= rounded;
    }
}